

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharedbook.c
# Opt level: O2

int vorbis_book_init_decode(codebook *c,static_codebook *s)

{
  size_t sVar1;
  undefined8 uVar2;
  int iVar3;
  ogg_uint32_t *poVar4;
  ogg_uint32_t *poVar5;
  float *pfVar6;
  int *piVar7;
  char *pcVar8;
  byte bVar9;
  uint uVar10;
  long lVar11;
  size_t sVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  void *__base;
  int iVar20;
  int *sparsemap;
  long lVar21;
  size_t sStack_50;
  long alStack_48 [3];
  
  c->quantvals = 0;
  c->minval = 0;
  *(undefined8 *)&c->delta = 0;
  c->dec_firsttable = (ogg_uint32_t *)0x0;
  c->dec_firsttablen = 0;
  c->dec_maxlength = 0;
  c->dec_index = (int *)0x0;
  c->dec_codelengths = (char *)0x0;
  c->valuelist = (float *)0x0;
  c->codelist = (ogg_uint32_t *)0x0;
  c->used_entries = 0;
  c->c = (static_codebook *)0x0;
  c->dim = 0;
  c->entries = 0;
  lVar21 = s->entries;
  lVar11 = 0;
  lVar13 = 0;
  if (0 < lVar21) {
    lVar13 = lVar21;
  }
  alStack_48[2] = 0;
  for (; lVar13 != lVar11; lVar11 = lVar11 + 1) {
    alStack_48[2] = (long)((int)alStack_48[2] + (uint)('\0' < s->lengthlist[lVar11]));
  }
  c->entries = lVar21;
  c->used_entries = alStack_48[2];
  c->dim = s->dim;
  if ((int)alStack_48[2] != 0) {
    sStack_50 = 0x1ba9cc;
    poVar4 = _make_words(s->lengthlist,lVar21,alStack_48[2]);
    lVar13 = alStack_48[2];
    lVar21 = -(alStack_48[2] * 8 + 0xfU & 0xfffffffffffffff0);
    __base = (void *)((long)alStack_48 + lVar21);
    if (poVar4 == (ogg_uint32_t *)0x0) {
      *(undefined8 *)((long)alStack_48 + lVar21 + -8) = 0x1babc1;
      vorbis_book_clear(c);
      *(undefined8 *)((long)alStack_48 + lVar21 + -8) = 0xffffffffffffffff;
      return (int)*(undefined8 *)((long)alStack_48 + lVar21 + -8);
    }
    sVar12 = alStack_48[2] * 4;
    for (lVar11 = 0; sVar12 - lVar11 != 0; lVar11 = lVar11 + 4) {
      uVar17 = *(uint *)((long)poVar4 + lVar11);
      uVar17 = uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 | uVar17 << 0x18;
      uVar17 = (uVar17 & 0xf0f0f0f) << 4 | uVar17 >> 4 & 0xf0f0f0f;
      uVar17 = (uVar17 >> 2 & 0x33333333) + (uVar17 & 0x33333333) * 4;
      *(uint *)((long)poVar4 + lVar11) = (uVar17 >> 1 & 0x55555555) + (uVar17 & 0x55555555) * 2;
      *(long *)((long)__base + lVar11 * 2) = lVar11 + (long)poVar4;
    }
    *(undefined8 *)((long)alStack_48 + lVar21 + -8) = 8;
    sVar1 = *(size_t *)((long)alStack_48 + lVar21 + -8);
    alStack_48[1] = sVar12;
    *(undefined8 *)((long)alStack_48 + lVar21 + -8) = 0x1baa76;
    qsort(__base,lVar13,sVar1,sort32a);
    lVar21 = alStack_48[1];
    sparsemap = (int *)((long)__base - (alStack_48[2] * 4 + 0xfU & 0xfffffffffffffff0));
    sparsemap[-2] = 0x1baa98;
    sparsemap[-1] = 0;
    poVar5 = (ogg_uint32_t *)malloc(lVar21);
    lVar21 = alStack_48[2];
    c->codelist = poVar5;
    for (sVar12 = 0; lVar21 != sVar12; sVar12 = sVar12 + 1) {
      sparsemap[(int)((ulong)(*(long *)((long)__base + sVar12 * 8) - (long)poVar4) >> 2)] =
           (int)sVar12;
    }
    for (sVar12 = 0; lVar21 != sVar12; sVar12 = sVar12 + 1) {
      poVar5[sparsemap[sVar12]] = poVar4[sVar12];
    }
    sparsemap[-2] = 0x1baae1;
    sparsemap[-1] = 0;
    free(poVar4);
    sparsemap[-2] = 0x1baaef;
    sparsemap[-1] = 0;
    pfVar6 = _book_unquantize(s,(int)lVar21,sparsemap);
    lVar21 = alStack_48[1];
    c->valuelist = pfVar6;
    sparsemap[-2] = 0x1baafc;
    sparsemap[-1] = 0;
    piVar7 = (int *)malloc(lVar21);
    c->dec_index = piVar7;
    lVar21 = s->entries;
    lVar11 = 0;
    lVar13 = 0;
    if (0 < lVar21) {
      lVar13 = lVar21;
    }
    iVar14 = 0;
    for (; sVar12 = (size_t)iVar14, lVar13 != lVar11; lVar11 = lVar11 + 1) {
      if ('\0' < s->lengthlist[lVar11]) {
        iVar14 = iVar14 + 1;
        piVar7[sparsemap[sVar12]] = (int)lVar11;
      }
    }
    sparsemap[-2] = 0x1bab3b;
    sparsemap[-1] = 0;
    pcVar8 = (char *)malloc(sVar12);
    c->dec_codelengths = pcVar8;
    c->dec_maxlength = 0;
    iVar14 = 0;
    uVar17 = 0;
    for (lVar13 = 0; lVar11 = (long)(int)uVar17, lVar13 < lVar21; lVar13 = lVar13 + 1) {
      if ('\0' < s->lengthlist[lVar13]) {
        uVar17 = uVar17 + 1;
        c->dec_codelengths[sparsemap[lVar11]] = s->lengthlist[lVar13];
        iVar3 = (int)s->lengthlist[lVar13];
        iVar14 = c->dec_maxlength;
        if (iVar14 < iVar3) {
          c->dec_maxlength = iVar3;
          iVar14 = iVar3;
        }
      }
      lVar21 = s->entries;
    }
    if ((uVar17 == 1) && (iVar14 == 1)) {
      c->dec_firsttablen = 1;
      sparsemap[-2] = 2;
      sparsemap[-1] = 0;
      sVar12 = *(size_t *)(sparsemap + -2);
      sparsemap[-2] = 4;
      sparsemap[-1] = 0;
      sVar1 = *(size_t *)(sparsemap + -2);
      sparsemap[-2] = 0x1baba4;
      sparsemap[-1] = 0;
      poVar4 = (ogg_uint32_t *)calloc(sVar12,sVar1);
      c->dec_firsttable = poVar4;
      poVar4[0] = 1;
      poVar4[1] = 1;
    }
    else {
      lVar21 = c->used_entries;
      sparsemap[-2] = 0x1babde;
      sparsemap[-1] = 0;
      iVar3 = ov_ilog((ogg_uint32_t)lVar21);
      sparsemap[-2] = 0xc;
      sparsemap[-1] = 0;
      iVar14 = (int)*(undefined8 *)(sparsemap + -2);
      if (iVar3 < 0xc) {
        iVar14 = iVar3;
      }
      sparsemap[-2] = 5;
      sparsemap[-1] = 0;
      iVar20 = (int)*(undefined8 *)(sparsemap + -2);
      if (8 < iVar3) {
        iVar20 = iVar14 + -4;
      }
      c->dec_firsttablen = iVar20;
      sparsemap[-2] = 1;
      sparsemap[-1] = 0;
      uVar2 = *(undefined8 *)(sparsemap + -2);
      bVar9 = (byte)iVar20;
      uVar15 = (ulong)(uint)((int)uVar2 << (bVar9 & 0x1f));
      sparsemap[-2] = 4;
      sparsemap[-1] = 0;
      sVar12 = *(size_t *)(sparsemap + -2);
      alStack_48[2] = uVar15;
      sparsemap[-2] = 0x1bac11;
      sparsemap[-1] = 0;
      poVar4 = (ogg_uint32_t *)calloc(uVar15,sVar12);
      uVar15 = (ulong)uVar17;
      if ((int)uVar17 < 1) {
        uVar15 = 0;
      }
      c->dec_firsttable = poVar4;
      uVar19 = 0;
      while (uVar16 = uVar19, uVar16 != uVar15) {
        pcVar8 = c->dec_codelengths;
        uVar17 = (uint)pcVar8[uVar16];
        if (iVar20 < (int)uVar17) {
          uVar19 = uVar16 + 1;
        }
        else {
          uVar10 = c->codelist[uVar16];
          uVar10 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 |
                   uVar10 << 0x18;
          uVar10 = (uVar10 & 0xf0f0f0f) << 4 | uVar10 >> 4 & 0xf0f0f0f;
          uVar10 = (uVar10 >> 2 & 0x33333333) + (uVar10 & 0x33333333) * 4;
          for (iVar14 = 0; uVar19 = uVar16 + 1, iVar14 < (int)uVar2 << (bVar9 - (byte)uVar17 & 0x1f)
              ; iVar14 = iVar14 + 1) {
            poVar4[iVar14 << ((byte)uVar17 & 0x1f) |
                   (uVar10 >> 1 & 0x55555555) + (uVar10 & 0x55555555) * 2] =
                 (ogg_uint32_t)(uVar16 + 1);
            uVar17 = (uint)(byte)pcVar8[uVar16];
          }
        }
      }
      sparsemap[-2] = 0x20;
      sparsemap[-1] = 0;
      uVar2 = *(undefined8 *)(sparsemap + -2);
      uVar15 = 0;
      lVar21 = 0;
      for (iVar14 = 0; iVar14 != (int)alStack_48[2]; iVar14 = iVar14 + 1) {
        uVar10 = iVar14 << ((char)uVar2 - bVar9 & 0x1f);
        uVar17 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18
        ;
        uVar17 = (uVar17 & 0xf0f0f0f) << 4 | uVar17 >> 4 & 0xf0f0f0f;
        uVar17 = (uVar17 >> 2 & 0x33333333) + (uVar17 & 0x33333333) * 4;
        uVar17 = (uVar17 >> 1 & 0x55555555) + (uVar17 & 0x55555555) * 2;
        uVar19 = uVar15;
        lVar13 = lVar21;
        if (poVar4[uVar17] == 0) {
          do {
            uVar15 = uVar19;
            if (lVar11 <= (long)(uVar15 + 1)) break;
            uVar19 = uVar15 + 1;
          } while (c->codelist[uVar15 + 1] <= uVar10);
          lVar18 = lVar11;
          if (lVar11 < lVar21) {
            lVar18 = lVar21;
          }
          for (; (lVar13 = lVar18, lVar18 != lVar21 &&
                 (lVar13 = lVar21,
                 (c->codelist[lVar21] & (uint)(0xfffffffeL << (0x1f - bVar9 & 0x3f))) <= uVar10));
              lVar21 = lVar21 + 1) {
          }
          uVar16 = lVar11 - lVar13;
          uVar19 = 0x7fff;
          if (uVar15 < 0x7fff) {
            uVar19 = uVar15;
          }
          if (0x7ffe < uVar16) {
            uVar16 = 0x7fff;
          }
          poVar4[uVar17] = (uint)uVar16 | (int)uVar19 << 0xf | 0x80000000;
        }
        lVar21 = lVar13;
      }
    }
  }
  return 0;
}

Assistant:

int vorbis_book_init_decode(codebook *c,const static_codebook *s){
  int i,j,n=0,tabn;
  int *sortindex;

  memset(c,0,sizeof(*c));

  /* count actually used entries and find max length */
  for(i=0;i<s->entries;i++)
    if(s->lengthlist[i]>0)
      n++;

  c->entries=s->entries;
  c->used_entries=n;
  c->dim=s->dim;

  if(n>0){
    /* two different remappings go on here.

    First, we collapse the likely sparse codebook down only to
    actually represented values/words.  This collapsing needs to be
    indexed as map-valueless books are used to encode original entry
    positions as integers.

    Second, we reorder all vectors, including the entry index above,
    by sorted bitreversed codeword to allow treeless decode. */

    /* perform sort */
    ogg_uint32_t *codes=_make_words(s->lengthlist,s->entries,c->used_entries);
    ogg_uint32_t **codep=alloca(sizeof(*codep)*n);

    if(codes==NULL)goto err_out;

    for(i=0;i<n;i++){
      codes[i]=bitreverse(codes[i]);
      codep[i]=codes+i;
    }

    qsort(codep,n,sizeof(*codep),sort32a);

    sortindex=alloca(n*sizeof(*sortindex));
    c->codelist=_ogg_malloc(n*sizeof(*c->codelist));
    /* the index is a reverse index */
    for(i=0;i<n;i++){
      int position=codep[i]-codes;
      sortindex[position]=i;
    }

    for(i=0;i<n;i++)
      c->codelist[sortindex[i]]=codes[i];
    _ogg_free(codes);

    c->valuelist=_book_unquantize(s,n,sortindex);
    c->dec_index=_ogg_malloc(n*sizeof(*c->dec_index));

    for(n=0,i=0;i<s->entries;i++)
      if(s->lengthlist[i]>0)
        c->dec_index[sortindex[n++]]=i;

    c->dec_codelengths=_ogg_malloc(n*sizeof(*c->dec_codelengths));
    c->dec_maxlength=0;
    for(n=0,i=0;i<s->entries;i++)
      if(s->lengthlist[i]>0){
        c->dec_codelengths[sortindex[n++]]=s->lengthlist[i];
        if(s->lengthlist[i]>c->dec_maxlength)
          c->dec_maxlength=s->lengthlist[i];
      }

    if(n==1 && c->dec_maxlength==1){
      /* special case the 'single entry codebook' with a single bit
       fastpath table (that always returns entry 0 )in order to use
       unmodified decode paths. */
      c->dec_firsttablen=1;
      c->dec_firsttable=_ogg_calloc(2,sizeof(*c->dec_firsttable));
      c->dec_firsttable[0]=c->dec_firsttable[1]=1;

    }else{
      c->dec_firsttablen=ov_ilog(c->used_entries)-4; /* this is magic */
      if(c->dec_firsttablen<5)c->dec_firsttablen=5;
      if(c->dec_firsttablen>8)c->dec_firsttablen=8;

      tabn=1<<c->dec_firsttablen;
      c->dec_firsttable=_ogg_calloc(tabn,sizeof(*c->dec_firsttable));

      for(i=0;i<n;i++){
        if(c->dec_codelengths[i]<=c->dec_firsttablen){
          ogg_uint32_t orig=bitreverse(c->codelist[i]);
          for(j=0;j<(1<<(c->dec_firsttablen-c->dec_codelengths[i]));j++)
            c->dec_firsttable[orig|(j<<c->dec_codelengths[i])]=i+1;
        }
      }

      /* now fill in 'unused' entries in the firsttable with hi/lo search
         hints for the non-direct-hits */
      {
        ogg_uint32_t mask=0xfffffffeUL<<(31-c->dec_firsttablen);
        long lo=0,hi=0;

        for(i=0;i<tabn;i++){
          ogg_uint32_t word=i<<(32-c->dec_firsttablen);
          if(c->dec_firsttable[bitreverse(word)]==0){
            while((lo+1)<n && c->codelist[lo+1]<=word)lo++;
            while(    hi<n && word>=(c->codelist[hi]&mask))hi++;

            /* we only actually have 15 bits per hint to play with here.
               In order to overflow gracefully (nothing breaks, efficiency
               just drops), encode as the difference from the extremes. */
            {
              unsigned long loval=lo;
              unsigned long hival=n-hi;

              if(loval>0x7fff)loval=0x7fff;
              if(hival>0x7fff)hival=0x7fff;
              c->dec_firsttable[bitreverse(word)]=
                0x80000000UL | (loval<<15) | hival;
            }
          }
        }
      }
    }
  }

  return(0);
 err_out:
  vorbis_book_clear(c);
  return(-1);
}